

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O2

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uStack_60;
  uv_barrier_t barrier;
  uv_thread_t threads [4];
  
  iVar1 = uv_barrier_init(&barrier,5);
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      if (lVar2 + 8 == 0x28) {
        iVar1 = uv_barrier_wait(&barrier);
        if (0 < iVar1) {
          uv_barrier_destroy(&barrier);
        }
        lVar2 = 0;
        do {
          if (lVar2 + 8 == 0x28) {
            return 0;
          }
          iVar1 = uv_thread_join((long)threads + lVar2);
          lVar2 = lVar2 + 8;
        } while (iVar1 == 0);
        pcVar3 = "0 == uv_thread_join(&threads[i])";
        uStack_60 = 0x87;
        goto LAB_001134c7;
      }
      iVar1 = uv_thread_create((long)threads + lVar2,serial_worker,&barrier);
      lVar2 = lVar2 + 8;
    } while (iVar1 == 0);
    pcVar3 = "0 == uv_thread_create(&threads[i], serial_worker, &barrier)";
    uStack_60 = 0x81;
  }
  else {
    pcVar3 = "0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1)";
    uStack_60 = 0x7e;
  }
LAB_001134c7:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-barrier.c"
          ,uStack_60,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT(0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_create(&threads[i], serial_worker, &barrier));

  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_join(&threads[i]));

  return 0;
}